

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O0

void __thiscall
GenerateToAddressRequestHandler::~GenerateToAddressRequestHandler
          (GenerateToAddressRequestHandler *this)

{
  long lVar1;
  GenerateToAddressRequestHandler *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ~GenerateToAddressRequestHandler(in_RDI);
  operator_delete(in_RDI,0x28);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

UniValue PrepareRequest(const std::string& method, const std::vector<std::string>& args) override
    {
        address_str = args.at(1);
        UniValue params{RPCConvertValues("generatetoaddress", args)};
        return JSONRPCRequestObj("generatetoaddress", params, 1);
    }